

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

exr_result_t
exr_read_scanline_chunk_info(exr_const_context_t ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  exr_storage_t eVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  _internal_exr_part *part;
  ulong uVar5;
  exr_result_t eVar6;
  int iVar7;
  int iVar8;
  code *UNRECOVERED_JUMPTABLE_00;
  uint uVar9;
  char *pcVar10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint64_t dataoff;
  int32_t data [3];
  uint64_t *ctable;
  uint64_t chunkmin;
  int64_t ddata [3];
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar15;
  ulong local_88;
  ulong local_80;
  int local_74 [3];
  ulong local_68;
  ulong local_60;
  uint64_t *local_58;
  ulong local_50;
  uint64_t local_48;
  ulong local_40;
  ulong local_38;
  
  uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt != (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar11 = 7;
LAB_00120787:
    eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,uVar11);
    return eVar6;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar6 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar6;
  }
  if (cinfo == (exr_chunk_info_t *)0x0) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar11 = 3;
    goto LAB_00120787;
  }
  part = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
  eVar1 = part->storage_mode;
  if ((eVar1 | EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_DEEP_TILED) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar11 = 0x12;
    goto LAB_00120787;
  }
  uVar2 = (part->data_window).min.field_0.field_0.y;
  iVar8 = (part->data_window).max.field_0.field_0.y;
  uVar14 = y - uVar2;
  if (iVar8 < y || y < (int)uVar2) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
    pcVar10 = "Invalid request for scanline %d outside range of data window (%d - %d)";
    uVar14 = uVar2;
    iVar7 = iVar8;
LAB_00120904:
    eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,3,pcVar10,y,uVar14,iVar7);
    return eVar6;
  }
  iVar3 = (part->data_window).min.field_0.field_0.x;
  iVar4 = (part->data_window).max.field_0.field_0.x;
  uVar12 = (uint)part->lines_per_chunk;
  local_68 = (ulong)uVar12;
  if (1 < (int)uVar12) {
    uVar14 = (int)uVar14 / (int)uVar12;
  }
  iVar7 = part->chunk_count;
  if (((int)uVar14 < 0) || (iVar7 <= (int)uVar14)) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
    pcVar10 = "Invalid request for scanline %d in chunk %d outside chunk count %d";
    goto LAB_00120904;
  }
  iVar7 = uVar14 * uVar12;
  uVar9 = iVar7 + uVar2;
  local_60 = (ulong)uVar9;
  cinfo->idx = uVar14;
  cinfo->type = (uint8_t)eVar1;
  cinfo->compression = (char)part->comp_type;
  cinfo->start_x = iVar3;
  cinfo->start_y = uVar9;
  cinfo->width = (iVar4 - iVar3) + 1;
  cinfo->height = uVar12;
  if (iVar7 < 0) {
    cinfo->start_y = uVar2;
    iVar7 = iVar7 + uVar12;
LAB_0012091e:
    cinfo->height = iVar7;
  }
  else if (iVar8 < (int)(uVar9 + uVar12)) {
    iVar7 = (iVar8 - uVar9) + 1;
    goto LAB_0012091e;
  }
  cinfo->level_x = '\0';
  cinfo->level_y = '\0';
  eVar6 = extract_chunk_table((_internal_exr_context *)ctxt,part,&local_58,&local_50);
  if (eVar6 != 0) {
    return eVar6;
  }
  uVar5 = *(ulong *)(ctxt + 0x98);
  local_88 = local_58[uVar14];
  if ((local_88 < local_50) || ((0 < (long)uVar5 && (uVar5 < local_88)))) {
    eVar6 = (**(code **)(ctxt + 0x48))
                      (ctxt,0x16,
                       "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %lu"
                       ,y,uVar14);
    return eVar6;
  }
  local_80 = 0;
  iVar8 = (**(code **)(ctxt + 0x28))
                    (ctxt,local_74,
                     ((uint)(part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) -
                     (uint)(ctxt[5] == (_priv_exr_context_t)0x0)) * 4 + 8,&local_88,0,0);
  if (iVar8 != 0) {
    return iVar8;
  }
  if ((ctxt[5] == (_priv_exr_context_t)0x0) || (local_80 = 1, local_74[0] == part_index)) {
    uVar13 = local_80 & 0xffffffff;
    local_74[0] = local_74[uVar13];
    if ((int)local_60 == local_74[0]) {
      if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE) {
        iVar8 = (**(code **)(ctxt + 0x28))(ctxt,&local_48,0x18,&local_88,0,0);
        if (iVar8 != 0) {
          return iVar8;
        }
        if ((long)local_48 < 0) {
          pcVar10 = 
          "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %ld"
          ;
          local_40 = local_48;
        }
        else if ((local_40 & 0xffffffff80000000) == 0) {
          if ((local_38 & 0xffffffff80000000) == 0) {
            uVar13 = local_88 + local_48;
            cinfo->sample_count_data_offset = local_88;
            cinfo->sample_count_table_size = local_48;
            cinfo->data_offset = uVar13;
            cinfo->packed_size = local_40;
            cinfo->unpacked_size = local_38;
            if (((long)uVar5 < 1) || (uVar13 + local_40 <= uVar5 && uVar13 <= uVar5))
            goto LAB_00120bd7;
            pcVar10 = 
            "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %ld + data size %ld larger than file %ld"
            ;
            local_40 = local_48;
          }
          else {
            pcVar10 = 
            "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %ld"
            ;
            local_40 = local_38;
          }
        }
        else {
          pcVar10 = 
          "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %ld"
          ;
        }
      }
      else {
        local_38 = compute_chunk_unpack_size(y,cinfo->width,cinfo->height,(int)local_68,part);
        local_40 = (ulong)local_74[uVar13 + 1];
        if (((long)local_40 < 0) || (part->unpacked_size_per_chunk < local_40)) {
          pcVar10 = 
          "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %lu, must be between 0 and %lu"
          ;
        }
        else {
          cinfo->data_offset = local_88;
          cinfo->packed_size = local_40;
          cinfo->unpacked_size = local_38;
          cinfo->sample_count_data_offset = 0;
          cinfo->sample_count_table_size = 0;
          if (((long)uVar5 < 1) || (local_88 + local_40 <= uVar5)) {
LAB_00120bd7:
            if (local_40 != 0) {
              return 0;
            }
            if (local_38 == 0) {
              return 0;
            }
            eVar6 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid packed size of 0");
            return eVar6;
          }
          pcVar10 = 
          "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %lu, file offset %lu, size %ld"
          ;
        }
      }
      eVar6 = (**(code **)(ctxt + 0x48))(ctxt,0x16,pcVar10,y,uVar14,local_40);
      return eVar6;
    }
    uVar11 = CONCAT44(uVar15,(int)local_60);
    pcVar10 = 
    "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d";
  }
  else {
    uVar11 = CONCAT44(uVar15,part_index);
    pcVar10 = 
    "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d";
  }
  eVar6 = (**(code **)(ctxt + 0x48))(ctxt,0x16,pcVar10,y,uVar14,local_74[0],uVar11);
  return eVar6;
}

Assistant:

exr_result_t
exr_read_scanline_chunk_info (
    exr_const_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_result_t     rv;
    int              miny, cidx, rdcnt, lpc;
    int32_t          data[3];
    int64_t          ddata[3];
    int64_t          fsize;
    uint64_t         chunkmin, dataoff;
    exr_attr_box2i_t dw;
    uint64_t*        ctable;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!cinfo) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        return pctxt->standard_error (pctxt, EXR_ERR_SCAN_TILE_MIXEDAPI);
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y);
    }

    lpc  = part->lines_per_chunk;
    cidx = (y - dw.min.y);
    if (lpc > 1) cidx /= lpc;

    // do we need to invert this when reading decreasing y? it appears not
    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = (dw.min.y + cidx * lpc);

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count);
    }

    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= (dw.min.y - miny);
    }
    else if ((miny + lpc) > dw.max.y) { cinfo->height = (dw.max.y - miny + 1); }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    /* need to read from the file to get the packed chunk size */
    rv = extract_chunk_table (pctxt, part, &ctable, &chunkmin);
    if (rv != EXR_ERR_SUCCESS) return rv;

    fsize = pctxt->file_size;

    dataoff = ctable[cidx];
    if (dataoff < chunkmin || (fsize > 0 && dataoff > (uint64_t) fsize))
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %" PRIu64,
            y,
            cidx,
            dataoff);
    }

    /* TODO: Look at collapsing this into extract_chunk_leader, only
     * issue is more concrete error messages */
    /* multi part files have the part for validation */
    rdcnt = (pctxt->is_multipart) ? 2 : 1;
    /* deep has 64-bit data, so be variable about what we read */
    if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) ++rdcnt;

    rv = pctxt->do_read (
        pctxt,
        data,
        (size_t) (rdcnt) * sizeof (int32_t),
        &dataoff,
        NULL,
        EXR_MUST_READ_ALL);

    if (rv != EXR_ERR_SUCCESS) return rv;

    priv_to_native32 (data, rdcnt);

    rdcnt = 0;
    if (pctxt->is_multipart)
    {
        if (data[rdcnt] != part_index)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d",
                y,
                cidx,
                data[rdcnt],
                part_index);
        }
        ++rdcnt;
    }
    if (miny != data[rdcnt])
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d",
            y,
            cidx,
            data[rdcnt],
            miny);
    }

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        rv = pctxt->do_read (
            pctxt,
            ddata,
            3 * sizeof (int64_t),
            &dataoff,
            NULL,
            EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
        priv_to_native64 (ddata, 3);

        if (ddata[0] < 0)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %" PRId64,
                y,
                cidx,
                ddata[0]);
        }
        if (ddata[1] < 0 || ddata[1] > (int64_t) INT_MAX)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %" PRId64,
                y,
                cidx,
                ddata[1]);
        }
        if (ddata[2] < 0 || ddata[2] > (int64_t) INT_MAX)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %" PRId64,
                y,
                cidx,
                ddata[2]);
        }

        cinfo->sample_count_data_offset = dataoff;
        cinfo->sample_count_table_size  = (uint64_t) ddata[0];
        cinfo->data_offset              = dataoff + (uint64_t) ddata[0];
        cinfo->packed_size              = (uint64_t) ddata[1];
        cinfo->unpacked_size            = (uint64_t) ddata[2];

        if (fsize > 0 &&
            ((cinfo->sample_count_data_offset +
              cinfo->sample_count_table_size) > ((uint64_t) fsize) ||
             (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize)))
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %" PRId64
                " + data size %" PRId64 " larger than file %" PRId64,
                y,
                cidx,
                ddata[0],
                ddata[1],
                fsize);
        }
    }
    else
    {
        uint64_t unpacksize = compute_chunk_unpack_size (
            y, cinfo->width, cinfo->height, lpc, part);

        ++rdcnt;
        if (data[rdcnt] < 0 ||
            (uint64_t) data[rdcnt] > part->unpacked_size_per_chunk)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %" PRIu64
                ", must be between 0 and %" PRIu64,
                y,
                cidx,
                (uint64_t) data[rdcnt],
                part->unpacked_size_per_chunk);
        }

        cinfo->data_offset              = dataoff;
        cinfo->packed_size              = (uint64_t) data[rdcnt];
        cinfo->unpacked_size            = unpacksize;
        cinfo->sample_count_data_offset = 0;
        cinfo->sample_count_table_size  = 0;

        if (fsize > 0 &&
            (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize))
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %" PRIu64
                ", file offset %" PRIu64 ", size %" PRId64,
                y,
                cidx,
                cinfo->packed_size,
                cinfo->data_offset,
                fsize);
        }
    }

    if (cinfo->packed_size == 0 && cinfo->unpacked_size > 0)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid packed size of 0");
    return EXR_ERR_SUCCESS;
}